

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_struct_field_sync_write
          (t_rs_generator *this,string *field_var,bool field_var_is_ref,t_field *tfield,e_req req)

{
  bool bVar1;
  byte bVar2;
  int32_t iVar3;
  t_type *ptVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  byte local_37b;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  allocator local_291;
  string local_290;
  string local_270;
  string local_250;
  allocator local_229;
  string local_228 [8];
  string let_var;
  string field_ident_string;
  ostringstream local_1b8 [8];
  ostringstream field_stream;
  t_type *actual_type;
  t_type *field_type;
  e_req req_local;
  t_field *tfield_local;
  bool field_var_is_ref_local;
  string *field_var_local;
  t_rs_generator *this_local;
  
  ptVar4 = t_field::get_type(tfield);
  field_stream._368_8_ = t_generator::get_true_type(ptVar4);
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  poVar5 = std::operator<<((ostream *)local_1b8,"TFieldIdentifier::new(");
  poVar5 = std::operator<<(poVar5,"\"");
  psVar6 = t_field::get_name_abi_cxx11_(tfield);
  poVar5 = std::operator<<(poVar5,(string *)psVar6);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,", ");
  to_rust_field_type_enum_abi_cxx11_((string *)((long)&field_ident_string.field_2 + 8),this,ptVar4);
  poVar5 = std::operator<<(poVar5,(string *)(field_ident_string.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,", ");
  iVar3 = t_field::get_key(tfield);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  std::operator<<(poVar5,")");
  std::__cxx11::string::~string((string *)(field_ident_string.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::str();
  bVar1 = is_optional(this,req);
  if (bVar1) {
    bVar2 = (**(code **)(*(long *)field_stream._368_8_ + 0x28))();
    local_37b = 0;
    if ((bVar2 & 1) != 0) {
      local_37b = (**(code **)(*(long *)field_stream._368_8_ + 0x30))();
      local_37b = local_37b ^ 0xff;
    }
    pcVar7 = "ref fld_var";
    if ((local_37b & 1) != 0) {
      pcVar7 = "fld_var";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,pcVar7,&local_229);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_250);
    poVar5 = std::operator<<(poVar5,"if let Some(");
    poVar5 = std::operator<<(poVar5,local_228);
    poVar5 = std::operator<<(poVar5,") = ");
    poVar5 = std::operator<<(poVar5,(string *)field_var);
    poVar5 = std::operator<<(poVar5," {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_250);
    t_generator::indent_up(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_270,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_270);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_begin(&");
    poVar5 = std::operator<<(poVar5,(string *)(let_var.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,")?;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,"fld_var",&local_291);
    render_type_sync_write(this,&local_290,true,ptVar4);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    t_generator::indent_abi_cxx11_(&local_2b8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_2b8);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_end()?");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2b8);
    t_generator::indent_down(&this->super_t_generator);
    t_generator::indent_abi_cxx11_(&local_2d8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_2d8);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string(local_228);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_2f8,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_2f8);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_begin(&");
    poVar5 = std::operator<<(poVar5,(string *)(let_var.field_2._M_local_buf + 8));
    poVar5 = std::operator<<(poVar5,")?;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2f8);
    ptVar4 = t_field::get_type(tfield);
    render_type_sync_write(this,field_var,field_var_is_ref,ptVar4);
    t_generator::indent_abi_cxx11_(&local_318,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_318);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_end()?;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_318);
  }
  std::__cxx11::string::~string((string *)(let_var.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  return;
}

Assistant:

void t_rs_generator::render_struct_field_sync_write(
  const string &field_var,
  bool field_var_is_ref,
  t_field *tfield,
  t_field::e_req req
) {
  t_type* field_type = tfield->get_type();
  t_type* actual_type = get_true_type(field_type);

  ostringstream field_stream;
  field_stream
    << "TFieldIdentifier::new("
    << "\"" << tfield->get_name() << "\"" << ", " // note: use *original* name
    << to_rust_field_type_enum(field_type) << ", "
    << tfield->get_key() << ")";
  string field_ident_string = field_stream.str();

  if (is_optional(req)) {
    string let_var((actual_type->is_base_type() && !actual_type->is_string()) ? "fld_var" : "ref fld_var");
    f_gen_ << indent() << "if let Some(" << let_var << ") = " << field_var << " {" << endl;
    indent_up();
    f_gen_ << indent() << "o_prot.write_field_begin(&" << field_ident_string << ")?;" << endl;
    render_type_sync_write("fld_var", true, field_type);
    f_gen_ << indent() << "o_prot.write_field_end()?" << endl;
    indent_down();
    /* FIXME: rethink how I deal with OPT_IN_REQ_OUT
    if (req == t_field::T_OPT_IN_REQ_OUT) {
      f_gen_ << indent() << "let field_ident = " << field_ident_string << ";" << endl;
      f_gen_ << indent() << "o_prot.write_field_begin(&field_ident)?;" << endl;
      f_gen_ << indent() << "o_prot.write_field_end()?;" << endl;
    }*/
    f_gen_ << indent() << "}" << endl;
  } else {
    f_gen_ << indent() << "o_prot.write_field_begin(&" << field_ident_string << ")?;" << endl;
    render_type_sync_write(field_var, field_var_is_ref, tfield->get_type());
    f_gen_ << indent() << "o_prot.write_field_end()?;" << endl;
  }
}